

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux_joystick.c
# Opt level: O2

void pollAbsState(_GLFWjoystick *js)

{
  int iVar1;
  long lVar2;
  long lVar3;
  int code;
  long lVar4;
  
  lVar3 = 0x19f4;
  lVar4 = 0;
  for (lVar2 = 0x18f4; lVar2 != 0x19f4; lVar2 = lVar2 + 4) {
    if (-1 < *(int *)(js->name + lVar2 + -0x34)) {
      iVar1 = ioctl((js->linjs).fd,lVar4 + 0x80184540,js->name + lVar3 + -0x34);
      if (-1 < iVar1) {
        handleAbsEvent(js,(int)lVar4,*(int *)(js->name + lVar3 + -0x34));
      }
    }
    lVar4 = lVar4 + 1;
    lVar3 = lVar3 + 0x18;
  }
  return;
}

Assistant:

static void pollAbsState(_GLFWjoystick* js)
{
    for (int code = 0;  code < ABS_CNT;  code++)
    {
        if (js->linjs.absMap[code] < 0)
            continue;

        struct input_absinfo* info = &js->linjs.absInfo[code];

        if (ioctl(js->linjs.fd, EVIOCGABS(code), info) < 0)
            continue;

        handleAbsEvent(js, code, info->value);
    }
}